

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::ExpressionsInvalid2<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsInvalid2<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  bool bVar1;
  pointer ppVar2;
  TestError *pTVar3;
  string *local_3f8;
  string *local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  string local_2b0 [8];
  string shader_source_1;
  size_t string_index;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  undefined1 local_218 [8];
  string shader_source;
  size_t sub_script_index_1;
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  ulong local_188;
  size_t sub_script_index;
  size_t variable_declaration_index;
  string base_variable_string;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_150;
  iterator local_148;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_140;
  _supported_variable_types_map_const_iterator var_iterator;
  size_t var_type_index;
  undefined1 local_128 [8];
  string valid_relation_opeartors;
  string local_f8 [8];
  string variable_relation_opeartors [4];
  allocator<char> local_61;
  string *local_60;
  string local_58 [8];
  string shader_variable_declarations [2];
  TestShaderType tested_shader_type_local;
  ExpressionsInvalid2<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  variable_relation_opeartors[3].field_2._M_local_buf[10] = '\x01';
  local_60 = local_58;
  shader_variable_declarations[1].field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58," x",&local_61);
  local_60 = (string *)(shader_variable_declarations[0].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(shader_variable_declarations[0].field_2._M_local_buf + 8)," y",
             (allocator<char> *)(variable_relation_opeartors[3].field_2._M_local_buf + 0xb));
  variable_relation_opeartors[3].field_2._M_local_buf[10] = '\0';
  std::allocator<char>::~allocator
            ((allocator<char> *)(variable_relation_opeartors[3].field_2._M_local_buf + 0xb));
  std::allocator<char>::~allocator(&local_61);
  valid_relation_opeartors.field_2._M_local_buf[0xb] = '\x01';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,
             "    float result = 0.0;\n\n    if(x < y)\n    {\n        result = 1.0;\n    }\n\n\n",
             (allocator<char> *)(valid_relation_opeartors.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_relation_opeartors[0].field_2._M_local_buf + 8),
             "    float result = 0.0;\n\n    if(x <= y)\n    {\n        result = 1.0;\n    }\n\n\n",
             (allocator<char> *)(valid_relation_opeartors.field_2._M_local_buf + 0xe));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_relation_opeartors[1].field_2._M_local_buf + 8),
             "    float result = 0.0;\n\n    if(x > y)\n    {\n        result = 1.0;\n    }\n\n\n",
             (allocator<char> *)(valid_relation_opeartors.field_2._M_local_buf + 0xd));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_relation_opeartors[2].field_2._M_local_buf + 8),
             "    float result = 0.0;\n\n    if(x >= y)\n    {\n        result = 1.0;\n    }\n\n\n",
             (allocator<char> *)(valid_relation_opeartors.field_2._M_local_buf + 0xc));
  valid_relation_opeartors.field_2._M_local_buf[0xb] = '\0';
  std::allocator<char>::~allocator
            ((allocator<char> *)(valid_relation_opeartors.field_2._M_local_buf + 0xc));
  std::allocator<char>::~allocator
            ((allocator<char> *)(valid_relation_opeartors.field_2._M_local_buf + 0xd));
  std::allocator<char>::~allocator
            ((allocator<char> *)(valid_relation_opeartors.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator
            ((allocator<char> *)(valid_relation_opeartors.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,
             "    float result = 0.0;\n\n    if(x == y)\n    {\n        result = 1.0;\n    }\n\n\n",
             (allocator<char> *)((long)&var_type_index + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&var_type_index + 7));
  var_iterator._M_node = (_Base_ptr)0x0;
  while( true ) {
    if ((_Base_ptr)0x28 < var_iterator._M_node) {
      std::__cxx11::string::~string((string *)local_128);
      local_3e0 = (string *)(variable_relation_opeartors[3].field_2._M_local_buf + 8);
      do {
        local_3e0 = local_3e0 + -0x20;
        std::__cxx11::string::~string(local_3e0);
      } while (local_3e0 != local_f8);
      local_3f8 = (string *)(shader_variable_declarations[1].field_2._M_local_buf + 8);
      do {
        local_3f8 = local_3f8 + -0x20;
        std::__cxx11::string::~string(local_3f8);
      } while (local_3f8 != local_58);
      return;
    }
    local_148._M_node =
         (_Base_ptr)
         std::
         map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
         ::find((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                 *)supported_variable_types_map,
                (key_type *)(Interface::GL::var_types + (long)var_iterator._M_node * 4));
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_140,&local_148);
    base_variable_string.field_2._8_8_ =
         std::
         map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
         ::end((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                *)supported_variable_types_map);
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_150,(iterator *)((long)&base_variable_string.field_2 + 8));
    bVar1 = std::operator!=(&local_140,&local_150);
    if (!bVar1) break;
    std::__cxx11::string::string((string *)&variable_declaration_index);
    for (sub_script_index = 0; sub_script_index < 2; sub_script_index = sub_script_index + 1) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
               ::operator->(&local_140);
      std::__cxx11::string::operator+=
                ((string *)&variable_declaration_index,(string *)&ppVar2->second);
      std::__cxx11::string::operator+=
                ((string *)&variable_declaration_index,
                 (string *)
                 (shader_variable_declarations[sub_script_index - 1].field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=
                ((string *)&variable_declaration_index,"[1][1][1][1][1][1][1][1] = ");
      for (local_188 = 0; local_188 < 8; local_188 = local_188 + 1) {
        ppVar2 = std::
                 _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
                 ::operator->(&local_140);
        std::__cxx11::string::string(local_1c8,(string *)&ppVar2->second);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1e8,"[1]",(allocator<char> *)((long)&sub_script_index_1 + 7));
        (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
          super_TestNode._vptr_TestNode[6])(local_1a8,this,local_1c8,local_1e8,8 - local_188);
        std::__cxx11::string::operator+=((string *)&variable_declaration_index,local_1a8);
        std::__cxx11::string::~string(local_1a8);
        std::__cxx11::string::~string(local_1e8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&sub_script_index_1 + 7));
        std::__cxx11::string::~string(local_1c8);
        std::__cxx11::string::operator+=((string *)&variable_declaration_index,"(");
      }
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
               ::operator->(&local_140);
      std::__cxx11::string::operator+=
                ((string *)&variable_declaration_index,
                 (string *)&(ppVar2->second).initializer_with_ones);
      for (shader_source.field_2._8_8_ = 0; (ulong)shader_source.field_2._8_8_ < 8;
          shader_source.field_2._8_8_ = shader_source.field_2._8_8_ + 1) {
        std::__cxx11::string::operator+=((string *)&variable_declaration_index,")");
      }
      std::__cxx11::string::operator+=((string *)&variable_declaration_index,";\n");
    }
    std::__cxx11::string::string((string *)local_218);
    std::operator+(&local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &variable_declaration_index,"\n");
    std::__cxx11::string::operator=((string *)local_218,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   shader_start_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
    std::__cxx11::string::operator+=((string *)local_218,(string *)&cs);
    std::__cxx11::string::~string((string *)&cs);
    switch(shader_variable_declarations[1].field_2._12_4_) {
    case 0:
      break;
    case 1:
      std::__cxx11::string::operator+=((string *)local_218,"\n\tgl_Position = vec4(0.0);\n");
      break;
    case 2:
      break;
    case 3:
      std::__cxx11::string::operator+=((string *)local_218,(string *)emit_quad_abi_cxx11_);
      break;
    case 4:
      std::__cxx11::string::operator+=((string *)local_218,(string *)set_tesseation_abi_cxx11_);
      break;
    case 5:
      break;
    default:
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1140);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=((string *)local_218,(string *)shader_end_abi_cxx11_);
    vs = (string *)empty_string_abi_cxx11_;
    tcs = (string *)default_vertex_shader_source_abi_cxx11_;
    tes = (string *)default_tc_shader_source_abi_cxx11_;
    gs = (string *)default_te_shader_source_abi_cxx11_;
    fs = (string *)default_geometry_shader_source_abi_cxx11_;
    string_index = (size_t)default_fragment_shader_source_abi_cxx11_;
    switch(shader_variable_declarations[1].field_2._12_4_) {
    case 0:
      string_index = (size_t)local_218;
      break;
    case 1:
      tcs = (string *)local_218;
      break;
    case 2:
      vs = (string *)local_218;
      tcs = (string *)empty_string_abi_cxx11_;
      tes = (string *)empty_string_abi_cxx11_;
      gs = (string *)empty_string_abi_cxx11_;
      fs = (string *)empty_string_abi_cxx11_;
      string_index = (size_t)empty_string_abi_cxx11_;
      break;
    case 3:
      fs = (string *)local_218;
      break;
    case 4:
      tes = (string *)local_218;
      break;
    case 5:
      gs = (string *)local_218;
      break;
    default:
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1142);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[10])(this,tcs,tes,gs,fs,string_index,vs,1,0);
    std::__cxx11::string::~string((string *)local_218);
    for (shader_source_1.field_2._8_8_ = 0; (ulong)shader_source_1.field_2._8_8_ < 4;
        shader_source_1.field_2._8_8_ = shader_source_1.field_2._8_8_ + 1) {
      std::__cxx11::string::string(local_2b0);
      std::operator+(&local_2d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &variable_declaration_index,"\n");
      std::__cxx11::string::operator=(local_2b0,(string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::operator+(&local_2f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     shader_start_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&variable_relation_opeartors[shader_source_1.field_2._8_8_ + -1].field_2
                     + 8));
      std::__cxx11::string::operator+=(local_2b0,(string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      switch(shader_variable_declarations[1].field_2._12_4_) {
      case 0:
        break;
      case 1:
        std::__cxx11::string::operator+=(local_2b0,"\n\tgl_Position = vec4(0.0);\n");
        break;
      case 2:
        break;
      case 3:
        std::__cxx11::string::operator+=(local_2b0,(string *)emit_quad_abi_cxx11_);
        break;
      case 4:
        std::__cxx11::string::operator+=(local_2b0,(string *)set_tesseation_abi_cxx11_);
        break;
      case 5:
        break;
      default:
        pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar3,"Unrecognized shader type.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0x114f);
        __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      std::__cxx11::string::operator+=(local_2b0,(string *)shader_end_abi_cxx11_);
      (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
        super_TestNode._vptr_TestNode[8])
                (this,(ulong)(uint)shader_variable_declarations[1].field_2._12_4_,local_2b0);
      std::__cxx11::string::~string(local_2b0);
    }
    std::__cxx11::string::~string((string *)&variable_declaration_index);
    var_iterator._M_node = (_Base_ptr)((long)&(var_iterator._M_node)->_M_color + 1);
  }
  pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar3,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x1156);
  __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void ExpressionsInvalid2<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{

	std::string shader_variable_declarations[] = { " x", " y" };
	std::string variable_relation_opeartors[]  = {
		"    float result = 0.0;\n\n    if(x < y)\n    {\n        result = 1.0;\n    }\n\n\n",
		"    float result = 0.0;\n\n    if(x <= y)\n    {\n        result = 1.0;\n    }\n\n\n",
		"    float result = 0.0;\n\n    if(x > y)\n    {\n        result = 1.0;\n    }\n\n\n",
		"    float result = 0.0;\n\n    if(x >= y)\n    {\n        result = 1.0;\n    }\n\n\n"
	};
	std::string valid_relation_opeartors =
		"    float result = 0.0;\n\n    if(x == y)\n    {\n        result = 1.0;\n    }\n\n\n";

	for (size_t var_type_index = 0; var_type_index < API::n_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(API::var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string base_variable_string;

			for (size_t variable_declaration_index = 0;
				 variable_declaration_index <
				 sizeof(shader_variable_declarations) / sizeof(shader_variable_declarations[0]);
				 variable_declaration_index++)
			{
				base_variable_string += var_iterator->second.type;
				base_variable_string += shader_variable_declarations[variable_declaration_index];

				base_variable_string += "[1][1][1][1][1][1][1][1] = ";

				for (size_t sub_script_index = 0; sub_script_index < API::MAX_ARRAY_DIMENSIONS; sub_script_index++)
				{
					base_variable_string += this->extend_string(var_iterator->second.type, "[1]",
																API::MAX_ARRAY_DIMENSIONS - sub_script_index);
					base_variable_string += "(";
				}

				base_variable_string += var_iterator->second.initializer_with_ones;

				for (size_t sub_script_index = 0; sub_script_index < API::MAX_ARRAY_DIMENSIONS; sub_script_index++)
				{
					base_variable_string += ")";
				}

				base_variable_string += ";\n";
			} /* for (int variable_declaration_index = 0; ...) */

			/* Run positive case */
			{
				std::string shader_source;

				shader_source = base_variable_string + "\n";
				shader_source += shader_start + valid_relation_opeartors;

				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
			}

			/* Run negative cases */
			for (size_t string_index = 0;
				 string_index < sizeof(variable_relation_opeartors) / sizeof(variable_relation_opeartors[0]);
				 string_index++)
			{
				std::string shader_source;

				shader_source = base_variable_string + "\n";
				shader_source += shader_start + variable_relation_opeartors[string_index];

				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				this->execute_negative_test(tested_shader_type, shader_source);
			} /* for (int string_index = 0; ...) */
		}	 /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}